

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getvariable.cpp
# Opt level: O0

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>
duckdb::GetVariableBind
          (ClientContext *context,ScalarFunction *function,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *arguments)

{
  LogicalTypeId LVar1;
  undefined1 uVar2;
  uint uVar3;
  pointer pEVar4;
  ParameterNotResolvedException *this;
  undefined8 uVar5;
  type name;
  LogicalType *pLVar6;
  ClientContext *in_RSI;
  unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_> in_RDI;
  Value variable_name;
  Value value;
  string *in_stack_fffffffffffffe88;
  ClientConfig *in_stack_fffffffffffffe90;
  undefined7 in_stack_fffffffffffffe98;
  undefined1 in_stack_fffffffffffffe9f;
  Value *in_stack_fffffffffffffea0;
  undefined8 in_stack_fffffffffffffea8;
  LogicalTypeId id;
  ClientContext *this_00;
  LogicalType *in_stack_fffffffffffffeb0;
  string local_110 [8];
  Value *in_stack_fffffffffffffef8;
  Value *in_stack_ffffffffffffff28;
  undefined1 in_stack_ffffffffffffff6f;
  Expression *in_stack_ffffffffffffff70;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_ffffffffffffff78;
  allocator local_51;
  string local_50 [64];
  ClientContext *local_10;
  
  id = (LogicalTypeId)((ulong)in_stack_fffffffffffffea8 >> 0x38);
  local_10 = in_RSI;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                *)in_stack_fffffffffffffe90,(size_type)in_stack_fffffffffffffe88);
  pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                       *)in_stack_fffffffffffffe90);
  uVar3 = (*(pEVar4->super_BaseExpression)._vptr_BaseExpression[6])();
  if ((uVar3 & 1) == 0) {
    vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
    ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                  *)in_stack_fffffffffffffe90,(size_type)in_stack_fffffffffffffe88);
    pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                         *)in_stack_fffffffffffffe90);
    LVar1 = LogicalType::id(&pEVar4->return_type);
    if (LVar1 != UNKNOWN) {
      vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
      ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                    *)in_stack_fffffffffffffe90,(size_type)in_stack_fffffffffffffe88);
      pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                           *)in_stack_fffffffffffffe90);
      uVar3 = (*(pEVar4->super_BaseExpression)._vptr_BaseExpression[0xf])();
      if ((uVar3 & 1) == 0) {
        uVar5 = __cxa_allocate_exception(0x10);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string(local_50,"getvariable requires a constant input",&local_51);
        NotImplementedException::NotImplementedException
                  ((NotImplementedException *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
        __cxa_throw(uVar5,&NotImplementedException::typeinfo,
                    NotImplementedException::~NotImplementedException);
      }
      LogicalType::LogicalType(in_stack_fffffffffffffeb0,id);
      Value::Value(in_stack_fffffffffffffea0,
                   (LogicalType *)CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98));
      LogicalType::~LogicalType((LogicalType *)0x11fa848);
      this_00 = local_10;
      vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
      ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                    *)in_stack_fffffffffffffe90,(size_type)in_stack_fffffffffffffe88);
      name = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator*((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                        *)in_stack_fffffffffffffe90);
      ExpressionExecutor::EvaluateScalar
                ((ClientContext *)in_stack_ffffffffffffff78._M_pi,in_stack_ffffffffffffff70,
                 (bool)in_stack_ffffffffffffff6f);
      uVar2 = Value::IsNull((Value *)&stack0xffffffffffffff10);
      if (!(bool)uVar2) {
        in_stack_fffffffffffffe90 = ClientConfig::GetConfig(local_10);
        Value::ToString_abi_cxx11_(in_stack_ffffffffffffff28);
        ClientConfig::GetUserVariable
                  ((ClientConfig *)this_00,(string *)name,
                   (Value *)CONCAT17(uVar2,in_stack_fffffffffffffe98));
        ::std::__cxx11::string::~string(local_110);
      }
      pLVar6 = Value::type((Value *)&stack0xffffffffffffff68);
      LogicalType::operator=
                ((LogicalType *)CONCAT17(uVar2,in_stack_fffffffffffffe98),
                 (LogicalType *)in_stack_fffffffffffffe90);
      make_uniq<duckdb::GetVariableBindData,duckdb::Value>(in_stack_fffffffffffffef8);
      unique_ptr<duckdb::FunctionData,std::default_delete<duckdb::FunctionData>,true>::
      unique_ptr<duckdb::GetVariableBindData,std::default_delete<std::unique_ptr<duckdb::FunctionData,std::default_delete<duckdb::FunctionData>>>,void>
                ((unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>
                  *)in_stack_fffffffffffffe90,
                 (unique_ptr<duckdb::GetVariableBindData,_std::default_delete<duckdb::GetVariableBindData>_>
                  *)pLVar6);
      unique_ptr<duckdb::GetVariableBindData,_std::default_delete<duckdb::GetVariableBindData>,_true>
      ::~unique_ptr((unique_ptr<duckdb::GetVariableBindData,_std::default_delete<duckdb::GetVariableBindData>,_true>
                     *)0x11fa9d7);
      Value::~Value((Value *)in_stack_fffffffffffffe90);
      Value::~Value((Value *)in_stack_fffffffffffffe90);
      return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
             (__uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
             in_RDI._M_t.
             super___uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>
             .super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl;
    }
  }
  this = (ParameterNotResolvedException *)__cxa_allocate_exception(0x10);
  ParameterNotResolvedException::ParameterNotResolvedException(this);
  __cxa_throw(this,&ParameterNotResolvedException::typeinfo,
              ParameterNotResolvedException::~ParameterNotResolvedException);
}

Assistant:

static unique_ptr<FunctionData> GetVariableBind(ClientContext &context, ScalarFunction &function,
                                                vector<unique_ptr<Expression>> &arguments) {
	if (arguments[0]->HasParameter() || arguments[0]->return_type.id() == LogicalTypeId::UNKNOWN) {
		throw ParameterNotResolvedException();
	}
	if (!arguments[0]->IsFoldable()) {
		throw NotImplementedException("getvariable requires a constant input");
	}
	Value value;
	auto variable_name = ExpressionExecutor::EvaluateScalar(context, *arguments[0]);
	if (!variable_name.IsNull()) {
		ClientConfig::GetConfig(context).GetUserVariable(variable_name.ToString(), value);
	}
	function.return_type = value.type();
	return make_uniq<GetVariableBindData>(std::move(value));
}